

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

InterCode * __thiscall IrSim::icNoOp(InterCode *__return_storage_ptr__,IrSim *this,int kind,C_OP *t)

{
  undefined1 auStack_48 [48];
  
  Operand::Operand((Operand *)auStack_48,t);
  InterCode::InterCode(__return_storage_ptr__,kind,(Operand *)auStack_48);
  std::__cxx11::string::~string((string *)(auStack_48 + 8));
  return __return_storage_ptr__;
}

Assistant:

InterCode icNoOp(int kind, C_OP &t) const { return InterCode(kind, t); }